

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_emulsify(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int idam;
  
  idam = dice((int)((float)level * 1.5),3);
  bVar1 = saves_spell(level,(CHAR_DATA *)vo,0x14);
  if (bVar1) {
    idam = idam / 2;
  }
  act("$n writhes in agony as $s midsection suddenly distends.",(CHAR_DATA *)vo,(void *)0x0,
      (void *)0x0,0);
  act("Your insides twist with pain, as your organs begin to dissolve into viscous pools.",ch,
      (void *)0x0,vo,2);
  damage_new(ch,(CHAR_DATA *)vo,idam,sn,0x14,true,false,0,1,"emulsification");
  return;
}

Assistant:

void spell_emulsify(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam;
	float ddice = 1.5 * level;
	dam = dice((int)ddice, 3);

	if (saves_spell(level, victim, DAM_INTERNAL))
		dam /= 2;

	act("$n writhes in agony as $s midsection suddenly distends.", victim, 0, 0, TO_ROOM);
	act("Your insides twist with pain, as your organs begin to dissolve into viscous pools.", ch, 0, victim, TO_VICT);

	damage_new(ch, victim, dam, sn, DAM_INTERNAL, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "emulsification");
}